

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O3

void __thiscall gurkenlaeufer::ExamplesState::~ExamplesState(ExamplesState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_TableHead);
  this_00 = (this->_scenarioCollection).
            super___shared_ptr<gurkenlaeufer::IScenarioCollection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&(this->_backgroundSteps).
              super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&(this->_scenario).mainSteps.
              super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            (&(this->_scenario).tags.
              super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>);
  pcVar1 = (this->_scenario).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_scenario).description.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

ExamplesState(IParserStateFactory& factory, Scenario scenario, std::list<Step> backgroundSteps, const IScenarioCollectionSPtr& scenarioCollection)
        : CommonParserState(factory)
        , _scenario(std::move(scenario))
        , _backgroundSteps(std::move(backgroundSteps))
        , _scenarioCollection(scenarioCollection)
        , _isTableHead(true)
        , _exampleCount(0)
    {
    }